

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_rectangle_outline(rf_rec rec,int line_thick,rf_color color)

{
  rf_rec rec_00;
  rf_rec rec_01;
  rf_rec rec_02;
  rf_rec rec_03;
  undefined4 local_20;
  int line_thick_local;
  rf_color color_local;
  rf_rec rec_local;
  
  rec_local.x = rec.width;
  rec_local.y = rec.height;
  local_20 = line_thick;
  if ((rec_local.x < (float)line_thick) || (rec_local.y < (float)line_thick)) {
    if (rec_local.x <= rec_local.y) {
      if (rec_local.x < rec_local.y) {
        local_20 = (int)rec_local.x / 2;
      }
    }
    else {
      local_20 = (int)rec_local.y / 2;
    }
  }
  line_thick_local = (int)rec.x;
  color_local = (rf_color)rec.y;
  rec_03.y = (float)(int)(float)color_local;
  rec_03.x = (float)(int)(float)line_thick_local;
  rec_03.width = (float)(int)rec_local.x;
  rec_03.height = (float)local_20;
  rf_draw_rectangle_pro(rec_03,(rf_vec2)0x0,0.0,color);
  rec_02.y = (float)(int)((float)color_local + (float)local_20);
  rec_02.x = (float)(int)(((float)line_thick_local - (float)local_20) + rec_local.x);
  rec_02.width = (float)local_20;
  rec_02.height = (float)(int)(rec_local.y - ((float)local_20 + (float)local_20));
  rf_draw_rectangle_pro(rec_02,(rf_vec2)0x0,0.0,color);
  rec_01.y = (float)(int)(((float)color_local + rec_local.y) - (float)local_20);
  rec_01.x = (float)(int)(float)line_thick_local;
  rec_01.width = (float)(int)rec_local.x;
  rec_01.height = (float)local_20;
  rf_draw_rectangle_pro(rec_01,(rf_vec2)0x0,0.0,color);
  rec_00.y = (float)(int)((float)color_local + (float)local_20);
  rec_00.x = (float)(int)(float)line_thick_local;
  rec_00.width = (float)local_20;
  rec_00.height = (float)(int)(rec_local.y - (float)(local_20 * 2));
  rf_draw_rectangle_pro(rec_00,(rf_vec2)0x0,0.0,color);
  return;
}

Assistant:

RF_API void rf_draw_rectangle_outline(rf_rec rec, int line_thick, rf_color color)
{
    if (line_thick > rec.width || line_thick > rec.height)
    {
        if (rec.width > rec.height) line_thick = (int)rec.height/2;
        else if (rec.width < rec.height) line_thick = (int)rec.width/2;
    }

    rf_draw_rectangle_pro((rf_rec) {(int)rec.x, (int)rec.y, (int)rec.width, line_thick }, (rf_vec2){0.0f, 0.0f}, 0.0f, color);
    rf_draw_rectangle_pro((rf_rec) {(int)(rec.x - line_thick + rec.width), (int)(rec.y + line_thick), line_thick, (int)(rec.height - line_thick * 2.0f) }, (rf_vec2){0.0f, 0.0f}, 0.0f, color);
    rf_draw_rectangle_pro((rf_rec) {(int)rec.x, (int)(rec.y + rec.height - line_thick), (int)rec.width, line_thick }, (rf_vec2){0.0f, 0.0f}, 0.0f, color);
    rf_draw_rectangle_pro((rf_rec) {(int)rec.x, (int)(rec.y + line_thick), line_thick, (int)(rec.height - line_thick * 2) }, (rf_vec2) {0.0f, 0.0f }, 0.0f, color);
}